

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSessionActionSetsAttachInfo *value)

{
  NextChainResult NVar1;
  ValidateXrHandleResult VVar2;
  ulong uVar3;
  long lVar4;
  XrResult XVar5;
  XrActionSet_T *in_stack_fffffffffffffd28;
  allocator local_2c9;
  string *local_2c8;
  allocator local_2b9;
  string local_2b8;
  string local_298;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar5 = XR_SUCCESS;
  local_2c8 = command_name;
  if (value->type != XR_TYPE_SESSION_ACTION_SETS_ATTACH_INFO) {
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSessionActionSetsAttachInfo",value->type,
               "VUID-XrSessionActionSetsAttachInfo-type-type",
               XR_TYPE_SESSION_ACTION_SETS_ATTACH_INFO,"XR_TYPE_SESSION_ACTION_SETS_ATTACH_INFO");
  }
  if (!check_pnext) goto LAB_001478dd;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(instance_info,local_2c8,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2b8);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2b8,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::string
              ((string *)&local_2b8,"VUID-XrSessionActionSetsAttachInfo-next-unique",&local_2c9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_298,
               "Multiple structures of the same type(s) in \"next\" chain for XrSessionActionSetsAttachInfo struct"
               ,&local_2b9);
    CoreValidLogMessage(instance_info,&local_2b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_2b8);
LAB_001478a8:
    std::__cxx11::string::~string((string *)&error_message);
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSessionActionSetsAttachInfo-next-next",
               (allocator *)&local_298);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2b8,
               "Invalid structure(s) in \"next\" chain for XrSessionActionSetsAttachInfo struct \"next\""
               ,&local_2c9);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_001478a8;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001478dd:
  if (check_members && XVar5 == XR_SUCCESS) {
    XVar5 = XR_SUCCESS;
    if ((value->countActionSets == 0) && (value->actionSets != (XrActionSet *)0x0)) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrSessionActionSetsAttachInfo-countActionSets-arraylength",
                 (allocator *)&local_298);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_210,objects_info);
      std::__cxx11::string::string
                ((string *)&local_2b8,
                 "Structure XrSessionActionSetsAttachInfo member countActionSets is non-optional and must be greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_210,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_210);
      std::__cxx11::string::~string((string *)&error_message);
      XVar5 = XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->actionSets == (XrActionSet *)0x0) {
      if (value->countActionSets != 0) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrSessionActionSetsAttachInfo-actionSets-parameter",(allocator *)&local_298
                  );
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_228,objects_info);
        std::__cxx11::string::string
                  ((string *)&local_2b8,
                   "XrSessionActionSetsAttachInfo contains invalid NULL for XrActionSet \"actionSets\" is which not optional since \"countActionSets\" is set and must be non-NULL"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c8,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_228,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_228);
        std::__cxx11::string::~string((string *)&error_message);
        XVar5 = XR_ERROR_VALIDATION_FAILURE;
      }
    }
    else {
      lVar4 = 0;
      uVar3 = 0;
      do {
        if (value->countActionSets <= uVar3) {
          return XVar5;
        }
        VVar2 = VerifyXrActionSetHandle((XrActionSet *)((long)value->actionSets + lVar4));
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 8;
      } while (VVar2 == VALIDATE_XR_HANDLE_SUCCESS);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,"Invalid XrActionSet handle \"actionSets\" ");
      HandleToHexString<XrActionSet_T*>(in_stack_fffffffffffffd28);
      std::operator<<((ostream *)&error_message,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::string
                ((string *)&local_2b8,"VUID-XrSessionActionSetsAttachInfo-actionSets-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_240,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_2b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_240,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_240);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
      XVar5 = XR_ERROR_HANDLE_INVALID;
    }
  }
  return XVar5;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSessionActionSetsAttachInfo* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SESSION_ACTION_SETS_ATTACH_INFO) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSessionActionSetsAttachInfo",
                             value->type, "VUID-XrSessionActionSetsAttachInfo-type-type", XR_TYPE_SESSION_ACTION_SETS_ATTACH_INFO, "XR_TYPE_SESSION_ACTION_SETS_ATTACH_INFO");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSessionActionSetsAttachInfo-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSessionActionSetsAttachInfo struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSessionActionSetsAttachInfo : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSessionActionSetsAttachInfo-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSessionActionSetsAttachInfo struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->countActionSets && nullptr != value->actionSets) {
        CoreValidLogMessage(instance_info, "VUID-XrSessionActionSetsAttachInfo-countActionSets-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSessionActionSetsAttachInfo member countActionSets is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->actionSets && 0 != value->countActionSets) {
        CoreValidLogMessage(instance_info, "VUID-XrSessionActionSetsAttachInfo-actionSets-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrSessionActionSetsAttachInfo contains invalid NULL for XrActionSet \"actionSets\" is which not "
                            "optional since \"countActionSets\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->actionSets) {
        for (uint32_t value_actionsets_inc = 0; value_actionsets_inc < value->countActionSets; ++value_actionsets_inc) {
            {
                // writeValidateInlineHandleValidation
                ValidateXrHandleResult handle_result = VerifyXrActionSetHandle(&value->actionSets[value_actionsets_inc]);
                if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                    // Not a valid handle or NULL (which is not valid in this case)
                    std::ostringstream oss;
                    oss << "Invalid XrActionSet handle \"actionSets\" ";
                    oss << HandleToHexString(value->actionSets[value_actionsets_inc]);
                    CoreValidLogMessage(instance_info, "VUID-XrSessionActionSetsAttachInfo-actionSets-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                        objects_info, oss.str());
                    return XR_ERROR_HANDLE_INVALID;
                }
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}